

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateTestCaseUtil.hpp
# Opt level: O1

TestInstance * __thiscall
vkt::DynamicState::
InstanceFactory<vkt::DynamicState::(anonymous_namespace)::LineWidthParamTestInstance>::
createInstance(InstanceFactory<vkt::DynamicState::(anonymous_namespace)::LineWidthParamTestInstance>
               *this,Context *context)

{
  char *vertexShaderName;
  DynamicStateBaseClass *this_00;
  mapped_type *ppcVar1;
  VkPhysicalDeviceFeatures *pVVar2;
  NotSupportedError *this_01;
  RGBA local_88;
  float fStack_84;
  float afStack_80 [2];
  undefined1 local_78 [8];
  size_type sStack_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  local_58;
  
  this_00 = (DynamicStateBaseClass *)operator_new(0x1a8);
  std::
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::_Rb_tree(&local_58,&(this->m_shaderPaths)._M_t);
  local_78 = (undefined1  [8])((ulong)(uint)local_78._4_4_ << 0x20);
  ppcVar1 = std::
            map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
            ::operator[]((map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                          *)&local_58,(key_type *)local_78);
  vertexShaderName = *ppcVar1;
  local_88.m_value = 1;
  ppcVar1 = std::
            map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
            ::operator[]((map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                          *)&local_58,&local_88.m_value);
  DynamicStateBaseClass::DynamicStateBaseClass(this_00,context,vertexShaderName,*ppcVar1);
  (this_00->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__DynamicStateBaseClass_00d29d38;
  pVVar2 = Context::getDeviceFeatures((this_00->super_TestInstance).m_context);
  if (pVVar2->wideLines != 0) {
    this_00->m_topology = VK_PRIMITIVE_TOPOLOGY_LINE_LIST;
    tcu::RGBA::toVec(&local_88);
    local_78 = (undefined1  [8])0xbf800000;
    sStack_70 = 0x3f80000000000000;
    local_68._M_allocated_capacity = CONCAT44(fStack_84,local_88.m_value);
    local_68._8_4_ = afStack_80[0];
    local_68._12_4_ = afStack_80[1];
    std::
    vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
    ::emplace_back<vkt::DynamicState::PositionColorVertex>
              (&this_00->m_data,(PositionColorVertex *)local_78);
    tcu::RGBA::toVec(&local_88);
    local_78 = (undefined1  [8])0x3f800000;
    sStack_70 = 0x3f80000000000000;
    local_68._M_allocated_capacity = CONCAT44(fStack_84,local_88.m_value);
    local_68._8_4_ = afStack_80[0];
    local_68._12_4_ = afStack_80[1];
    std::
    vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
    ::emplace_back<vkt::DynamicState::PositionColorVertex>
              (&this_00->m_data,(PositionColorVertex *)local_78);
    DynamicStateBaseClass::initialize(this_00);
    std::
    _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
    ::~_Rb_tree(&local_58);
    return &this_00->super_TestInstance;
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_78 = (undefined1  [8])&local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,"Line width test is unsupported","");
  tcu::NotSupportedError::NotSupportedError(this_01,(string *)local_78);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

TestInstance* createInstance (Context& context) const
	{
		return new Instance(context, m_shaderPaths);
	}